

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O0

void __thiscall check_computations_of_distances::test_method(check_computations_of_distances *this)

{
  unsigned_long uVar1;
  double dVar2;
  undefined1 local_f0 [8];
  Persistence_landscape q;
  string local_c0;
  undefined1 local_a0 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag2;
  Persistence_landscape p;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag;
  check_computations_of_distances *this_local;
  
  diag.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"data/file_with_diagram",&local_49);
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_28,&local_48,-1,-1.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)
             &diag2.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_28,uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"data/file_with_diagram_1",
             (allocator<char> *)((long)&q.number_of_functions_for_projections_to_reals + 7));
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_a0,&local_c0,-1,-1.0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&q.number_of_functions_for_projections_to_reals + 7));
  uVar1 = std::numeric_limits<unsigned_long>::max();
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)local_f0,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_a0,uVar1);
  dVar2 = Gudhi::Persistence_representations::Persistence_landscape::distance
                    ((Persistence_landscape *)
                     &diag2.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Persistence_landscape *)local_f0,1.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,25.5824,epsilon);
  dVar2 = Gudhi::Persistence_representations::Persistence_landscape::distance
                    ((Persistence_landscape *)
                     &diag2.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Persistence_landscape *)local_f0,2.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,2.1264,epsilon);
  dVar2 = std::numeric_limits<double>::max();
  dVar2 = Gudhi::Persistence_representations::Persistence_landscape::distance
                    ((Persistence_landscape *)
                     &diag2.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Persistence_landscape *)local_f0,dVar2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,0.359068,epsilon);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)local_f0);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_a0);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)
             &diag2.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_of_distances) {
  std::vector<std::pair<double, double> > diag =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram");
  Persistence_landscape p(diag);
  std::vector<std::pair<double, double> > diag2 =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram_1");
  Persistence_landscape q(diag2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q), 25.5824, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, 2), 2.1264, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, std::numeric_limits<double>::max()), 0.359068, epsilon);
}